

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O2

int __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::link(dynamic_xpression<boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,char *__from,char *__to)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  int iVar2;
  
  xpression_linker<char>::accept<mpl_::bool_<false>>
            ((xpression_linker<char> *)__from,&this->super_repeat_end_matcher<mpl_::bool_<false>_>,
             (this->next_).xpr_.px);
  pmVar1 = (this->next_).xpr_.px;
  iVar2 = (*(pmVar1->
            super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._vptr_matchable[3])(pmVar1,__from);
  return iVar2;
}

Assistant:

virtual void link(xpression_linker<char_type> &linker) const
    {
        linker.accept(*static_cast<Matcher const *>(this), this->next_.matchable().get());
        this->next_.link(linker);
    }